

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipkinCollector.cpp
# Opt level: O1

void __thiscall
twitter::zipkin::thrift::ZipkinCollectorConcurrentClient::recv_submitZipkinBatch
          (ZipkinCollectorConcurrentClient *this,
          vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
          *_return,int32_t seqid)

{
  TConcurrentClientSyncInfo *sync;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  int iVar4;
  TException *this_00;
  undefined8 *puVar5;
  TApplicationException *this_01;
  size_t __nbytes;
  void *__buf;
  int32_t rseqid;
  TMessageType mtype;
  TConcurrentRecvSentry sentry;
  string fname;
  ZipkinCollector_submitZipkinBatch_presult result;
  TApplicationException x;
  uint local_b8;
  TMessageType local_b4;
  TConcurrentRecvSentry local_b0;
  vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
  *local_a0;
  string local_98;
  ZipkinCollector_submitZipkinBatch_presult local_78;
  undefined1 local_60 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  TApplicationExceptionType local_38;
  
  local_b8 = 0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  sync = &this->sync_;
  local_a0 = _return;
  apache::thrift::async::TConcurrentRecvSentry::TConcurrentRecvSentry(&local_b0,sync,seqid);
  while( true ) {
    bVar3 = apache::thrift::async::TConcurrentClientSyncInfo::getPending
                      (sync,&local_98,&local_b4,(int32_t *)&local_b8);
    if (!bVar3) {
      (*this->iprot_->_vptr_TProtocol[0x17])(this->iprot_,&local_98,&local_b4,&local_b8);
    }
    __nbytes = (size_t)local_b8;
    if (local_b8 == seqid) break;
    apache::thrift::async::TConcurrentClientSyncInfo::updatePending
              (sync,&local_98,local_b4,local_b8);
    apache::thrift::async::TConcurrentClientSyncInfo::waitForWork(sync,seqid);
  }
  if (local_b4 != T_REPLY) {
    if (local_b4 == T_EXCEPTION) {
      local_60._8_8_ = &local_48;
      local_60._16_8_ = 0;
      local_48._M_local_buf[0] = '\0';
      local_60._0_8_ = &PTR__TException_00276740;
      local_38 = UNKNOWN;
      apache::thrift::TApplicationException::read
                ((TApplicationException *)local_60,(int)this->iprot_,(void *)(ulong)local_b4,
                 0x276740);
      (*this->iprot_->_vptr_TProtocol[0x18])();
      peVar1 = (this->iprot_->ptrans_).
               super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var2 = (this->iprot_->ptrans_).
               super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (*peVar1->_vptr_TTransport[8])();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      apache::thrift::async::TConcurrentRecvSentry::commit(&local_b0);
      this_01 = (TApplicationException *)__cxa_allocate_exception(0x30);
      apache::thrift::TApplicationException::TApplicationException
                (this_01,(TApplicationException *)local_60);
      __cxa_throw(this_01,&apache::thrift::TApplicationException::typeinfo,
                  apache::thrift::TException::~TException);
    }
    (*this->iprot_->_vptr_TProtocol[0x2c])(this->iprot_,0xc);
    (*this->iprot_->_vptr_TProtocol[0x18])();
    peVar1 = (this->iprot_->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->iprot_->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_TTransport[8])();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_98);
  if (iVar4 == 0) {
    local_78._vptr_ZipkinCollector_submitZipkinBatch_presult =
         (_func_int **)&PTR__ZipkinCollector_submitZipkinBatch_presult_00277bf0;
    local_78.__isset =
         (_ZipkinCollector_submitZipkinBatch_presult__isset)((byte)local_78.__isset & 0xfe);
    local_78.success = local_a0;
    ZipkinCollector_submitZipkinBatch_presult::read(&local_78,(int)this->iprot_,__buf,__nbytes);
    (*this->iprot_->_vptr_TProtocol[0x18])();
    peVar1 = (this->iprot_->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->iprot_->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_TTransport[8])();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (((byte)local_78.__isset & 1) != 0) {
      apache::thrift::async::TConcurrentRecvSentry::commit(&local_b0);
      ZipkinCollector_submitZipkinBatch_presult::~ZipkinCollector_submitZipkinBatch_presult
                (&local_78);
      apache::thrift::async::TConcurrentRecvSentry::~TConcurrentRecvSentry(&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      return;
    }
    this_00 = (TException *)__cxa_allocate_exception(0x30);
    local_60._0_8_ = local_60 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,"submitZipkinBatch failed: unknown result","");
    apache::thrift::TException::TException(this_00,(string *)local_60);
    *(undefined ***)this_00 = &PTR__TException_00276740;
    *(undefined4 *)(this_00 + 1) = 5;
    __cxa_throw(this_00,&apache::thrift::TApplicationException::typeinfo,
                apache::thrift::TException::~TException);
  }
  (*this->iprot_->_vptr_TProtocol[0x2c])(this->iprot_,0xc);
  (*this->iprot_->_vptr_TProtocol[0x18])();
  peVar1 = (this->iprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->iprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (*peVar1->_vptr_TTransport[8])();
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
  puVar5[1] = puVar5 + 3;
  puVar5[2] = 0;
  *(undefined1 *)(puVar5 + 3) = 0;
  *puVar5 = &PTR__TException_002766f0;
  *(undefined4 *)(puVar5 + 5) = 1;
  __cxa_throw(puVar5,&apache::thrift::protocol::TProtocolException::typeinfo,
              apache::thrift::TException::~TException);
}

Assistant:

void ZipkinCollectorConcurrentClient::recv_submitZipkinBatch(std::vector<Response> & _return, const int32_t seqid)
{

  int32_t rseqid = 0;
  std::string fname;
  ::apache::thrift::protocol::TMessageType mtype;

  // the read mutex gets dropped and reacquired as part of waitForWork()
  // The destructor of this sentry wakes up other clients
  ::apache::thrift::async::TConcurrentRecvSentry sentry(&this->sync_, seqid);

  while(true) {
    if(!this->sync_.getPending(fname, mtype, rseqid)) {
      iprot_->readMessageBegin(fname, mtype, rseqid);
    }
    if(seqid == rseqid) {
      if (mtype == ::apache::thrift::protocol::T_EXCEPTION) {
        ::apache::thrift::TApplicationException x;
        x.read(iprot_);
        iprot_->readMessageEnd();
        iprot_->getTransport()->readEnd();
        sentry.commit();
        throw x;
      }
      if (mtype != ::apache::thrift::protocol::T_REPLY) {
        iprot_->skip(::apache::thrift::protocol::T_STRUCT);
        iprot_->readMessageEnd();
        iprot_->getTransport()->readEnd();
      }
      if (fname.compare("submitZipkinBatch") != 0) {
        iprot_->skip(::apache::thrift::protocol::T_STRUCT);
        iprot_->readMessageEnd();
        iprot_->getTransport()->readEnd();

        // in a bad state, don't commit
        using ::apache::thrift::protocol::TProtocolException;
        throw TProtocolException(TProtocolException::INVALID_DATA);
      }
      ZipkinCollector_submitZipkinBatch_presult result;
      result.success = &_return;
      result.read(iprot_);
      iprot_->readMessageEnd();
      iprot_->getTransport()->readEnd();

      if (result.__isset.success) {
        // _return pointer has now been filled
        sentry.commit();
        return;
      }
      // in a bad state, don't commit
      throw ::apache::thrift::TApplicationException(::apache::thrift::TApplicationException::MISSING_RESULT, "submitZipkinBatch failed: unknown result");
    }
    // seqid != rseqid
    this->sync_.updatePending(fname, mtype, rseqid);

    // this will temporarily unlock the readMutex, and let other clients get work done
    this->sync_.waitForWork(seqid);
  } // end while(true)
}